

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzrot::NodeIntStateGather
          (ChNodeFEAxyzrot *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double *T)

{
  long lVar1;
  double *pdVar2;
  Index index_3;
  double *pdVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  double local_28 [3];
  
  lVar1 = (x->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (lVar1 + -3 < (long)(ulong)off_x) goto LAB_0064ce59;
  pdVar2 = (x->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar3 = pdVar2 + off_x;
  uVar4 = 3;
  if (((ulong)pdVar3 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_0064ccdd;
  }
  else {
LAB_0064ccdd:
    uVar6 = 0;
    do {
      pdVar3[uVar6] = *(double *)(&(this->super_ChNodeFEAbase).field_0x20 + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar3[uVar4] = *(double *)(&(this->super_ChNodeFEAbase).field_0x20 + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  if (lVar1 + -4 < (long)(ulong)(off_x + 3)) goto LAB_0064ce59;
  pdVar2 = pdVar2 + (off_x + 3);
  uVar4 = 4;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 4) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_0064cd44;
  }
  else {
LAB_0064cd44:
    uVar6 = 0;
    do {
      pdVar2[uVar6] = *(double *)(&this->field_0x38 + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 4) {
    do {
      pdVar2[uVar4] = *(double *)(&this->field_0x38 + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 4);
  }
  if ((v->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
      (long)(ulong)off_v) goto LAB_0064ce59;
  pdVar3 = (v->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + off_v;
  uVar4 = 3;
  if (((ulong)pdVar3 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_0064cdac;
  }
  else {
LAB_0064cdac:
    uVar6 = 0;
    do {
      pdVar3[uVar6] = *(double *)(&this->field_0xa0 + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar3[uVar4] = *(double *)(&this->field_0xa0 + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  ChFrameMoving<double>::GetWvel_loc
            ((ChFrameMoving<double> *)&(this->super_ChNodeFEAbase).field_0x18);
  if ((v->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
      (long)(ulong)(off_v + 3)) {
LAB_0064ce59:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar3 = (v->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           (off_v + 3);
  uVar4 = 3;
  if (((ulong)pdVar3 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 == 0) goto LAB_0064ce38;
  }
  uVar6 = 0;
  do {
    pdVar3[uVar6] = local_28[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar4 != uVar6);
LAB_0064ce38:
  if (uVar4 < 3) {
    do {
      pdVar3[uVar4] = local_28[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  return;
}

Assistant:

void ChNodeFEAxyzrot::NodeIntStateGather(const unsigned int off_x,
                                         ChState& x,
                                         const unsigned int off_v,
                                         ChStateDelta& v,
                                         double& T) {
    x.segment(off_x + 0, 3) = this->coord.pos.eigen();
    x.segment(off_x + 3, 4) = this->coord.rot.eigen();

    v.segment(off_v + 0, 3) = this->coord_dt.pos.eigen();
    v.segment(off_v + 3, 3) = this->GetWvel_loc().eigen();
}